

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_cHRM_XYZ(png_const_structrp png_ptr,png_const_inforp info_ptr,double *red_X,double *red_Y,
                double *red_Z,double *green_X,double *green_Y,double *green_Z,double *blue_X,
                double *blue_Y,double *blue_Z)

{
  double *green_X_local;
  double *red_Z_local;
  double *red_Y_local;
  double *red_X_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     (((info_ptr->colorspace).flags & 2) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    if (red_X != (double *)0x0) {
      *red_X = (double)(info_ptr->colorspace).end_points_XYZ.red_X * 1e-05;
    }
    if (red_Y != (double *)0x0) {
      *red_Y = (double)(info_ptr->colorspace).end_points_XYZ.red_Y * 1e-05;
    }
    if (red_Z != (double *)0x0) {
      *red_Z = (double)(info_ptr->colorspace).end_points_XYZ.red_Z * 1e-05;
    }
    if (green_X != (double *)0x0) {
      *green_X = (double)(info_ptr->colorspace).end_points_XYZ.green_X * 1e-05;
    }
    if (green_Y != (double *)0x0) {
      *green_Y = (double)(info_ptr->colorspace).end_points_XYZ.green_Y * 1e-05;
    }
    if (green_Z != (double *)0x0) {
      *green_Z = (double)(info_ptr->colorspace).end_points_XYZ.green_Z * 1e-05;
    }
    if (blue_X != (double *)0x0) {
      *blue_X = (double)(info_ptr->colorspace).end_points_XYZ.blue_X * 1e-05;
    }
    if (blue_Y != (double *)0x0) {
      *blue_Y = (double)(info_ptr->colorspace).end_points_XYZ.blue_Y * 1e-05;
    }
    if (blue_Z != (double *)0x0) {
      *blue_Z = (double)(info_ptr->colorspace).end_points_XYZ.blue_Z * 1e-05;
    }
    png_ptr_local._4_4_ = 4;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_cHRM_XYZ(png_const_structrp png_ptr, png_const_inforp info_ptr,
    double *red_X, double *red_Y, double *red_Z, double *green_X,
    double *green_Y, double *green_Z, double *blue_X, double *blue_Y,
    double *blue_Z)
{
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      png_debug1(1, "in %s retrieval function", "cHRM_XYZ(float)");

      if (red_X != NULL)
         *red_X = png_float(png_ptr, info_ptr->colorspace.end_points_XYZ.red_X,
             "cHRM red X");
      if (red_Y != NULL)
         *red_Y = png_float(png_ptr, info_ptr->colorspace.end_points_XYZ.red_Y,
             "cHRM red Y");
      if (red_Z != NULL)
         *red_Z = png_float(png_ptr, info_ptr->colorspace.end_points_XYZ.red_Z,
             "cHRM red Z");
      if (green_X != NULL)
         *green_X = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.green_X, "cHRM green X");
      if (green_Y != NULL)
         *green_Y = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.green_Y, "cHRM green Y");
      if (green_Z != NULL)
         *green_Z = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.green_Z, "cHRM green Z");
      if (blue_X != NULL)
         *blue_X = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.blue_X, "cHRM blue X");
      if (blue_Y != NULL)
         *blue_Y = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.blue_Y, "cHRM blue Y");
      if (blue_Z != NULL)
         *blue_Z = png_float(png_ptr,
             info_ptr->colorspace.end_points_XYZ.blue_Z, "cHRM blue Z");
      return (PNG_INFO_cHRM);
   }

   return (0);
}